

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O1

geometry_t new_submesh_geometry(scene *scene,mesh *mesh,size_t begin,size_t end)

{
  geometry_t pgVar1;
  submesh_geometry submesh_geometry;
  scene_node local_68;
  code *local_48;
  code *local_40;
  code *local_38;
  code *local_30;
  code *local_28;
  mesh *local_20;
  size_t local_18;
  size_t local_10;
  undefined8 local_8;
  
  local_68.type = SUBMESH_GEOMETRY;
  local_68.hash = hash_submesh_geometry;
  local_68.compare = compare_submesh_geometry;
  local_68.cleanup = cleanup_submesh_geometry;
  local_48 = prepare_submesh_geometry;
  local_40 = intersect_submesh_geometry_ray;
  local_38 = get_submesh_geometry_attr;
  local_30 = sample_submesh_geometry_surface;
  local_28 = get_submesh_geometry_surface_area;
  local_8 = 0;
  local_20 = mesh;
  local_18 = begin;
  local_10 = end;
  pgVar1 = (geometry_t)insert_scene_node(scene,&local_68,0x68);
  return pgVar1;
}

Assistant:

geometry_t new_submesh_geometry(struct scene* scene, const struct mesh* mesh, size_t begin, size_t end) {
    struct submesh_geometry submesh_geometry = {
        .geometry = {
            .node = {
                .type    = SUBMESH_GEOMETRY,
                .hash    = hash_submesh_geometry,
                .compare = compare_submesh_geometry,
                .cleanup = cleanup_submesh_geometry
            },
            .prepare          = prepare_submesh_geometry,
            .intersect_ray    = intersect_submesh_geometry_ray,
            .get_attr         = get_submesh_geometry_attr,
            .sample_surface   = sample_submesh_geometry_surface,
            .get_surface_area = get_submesh_geometry_surface_area
        },
        .mesh = mesh,
        .begin = begin,
        .end = end
    };
    return (geometry_t)insert_scene_node(scene,
        &submesh_geometry.geometry.node,
        sizeof(submesh_geometry));
}